

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack13_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1fff;
  out[1] = *in >> 0xd & 0x1fff;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x1a;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x7f) << 6 | *puVar1;
  out[3] = *puVar2 >> 7 & 0x1fff;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x14;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 1) << 0xc | *puVar1;
  out[5] = *puVar2 >> 1 & 0x1fff;
  out[6] = *puVar2 >> 0xe & 0x1fff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1b;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0xff) << 5 | *puVar1;
  out[8] = *puVar2 >> 8 & 0x1fff;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x15;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 3) << 0xb | *puVar1;
  out[10] = *puVar2 >> 2 & 0x1fff;
  out[0xb] = *puVar2 >> 0xf & 0x1fff;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0x1c;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 0x1ff) << 4 | *puVar1;
  out[0xd] = *puVar2 >> 9 & 0x1fff;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 0x16;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 7) << 10 | *puVar1;
  out[0xf] = *puVar2 >> 3 & 0x1fff;
  out[0x10] = *puVar2 >> 0x10 & 0x1fff;
  puVar1 = out + 0x11;
  *puVar1 = *puVar2 >> 0x1d;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 0x3ff) << 3 | *puVar1;
  out[0x12] = *puVar2 >> 10 & 0x1fff;
  puVar1 = out + 0x13;
  *puVar1 = *puVar2 >> 0x17;
  puVar2 = in + 8;
  *puVar1 = (*puVar2 & 0xf) << 9 | *puVar1;
  out[0x14] = *puVar2 >> 4 & 0x1fff;
  out[0x15] = *puVar2 >> 0x11 & 0x1fff;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 0x1e;
  puVar2 = in + 9;
  *puVar1 = (*puVar2 & 0x7ff) << 2 | *puVar1;
  out[0x17] = *puVar2 >> 0xb & 0x1fff;
  puVar1 = out + 0x18;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 10;
  *puVar1 = (*puVar2 & 0x1f) << 8 | *puVar1;
  out[0x19] = *puVar2 >> 5 & 0x1fff;
  out[0x1a] = *puVar2 >> 0x12 & 0x1fff;
  puVar1 = out + 0x1b;
  *puVar1 = *puVar2 >> 0x1f;
  puVar2 = in + 0xb;
  *puVar1 = (*puVar2 & 0xfff) << 1 | *puVar1;
  out[0x1c] = *puVar2 >> 0xc & 0x1fff;
  puVar1 = out + 0x1d;
  *puVar1 = *puVar2 >> 0x19;
  puVar2 = in + 0xc;
  *puVar1 = (*puVar2 & 0x3f) << 7 | *puVar1;
  out[0x1e] = *puVar2 >> 6 & 0x1fff;
  out[0x1f] = *puVar2 >> 0x13;
  return in + 0xd;
}

Assistant:

const uint32_t *__fastunpack13_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 13);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 2)) << (13 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 13);
  out++;
  *out = ((*in) >> 15) % (1U << 13);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 9)) << (13 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 13);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 3)) << (13 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 13);
  out++;
  *out = ((*in) >> 16) % (1U << 13);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 10)) << (13 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 13);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 4)) << (13 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 13);
  out++;
  *out = ((*in) >> 17) % (1U << 13);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 11)) << (13 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 13);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 5)) << (13 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 13);
  out++;
  *out = ((*in) >> 18) % (1U << 13);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 12)) << (13 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 13);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 6)) << (13 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 13);
  out++;
  *out = ((*in) >> 19);
  ++in;
  out++;

  return in;
}